

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O1

string * __thiscall
KV::KeyValues::getKeyValue
          (string *__return_storage_ptr__,KeyValues *this,string *keyName,size_t index,
          string *defaultVal)

{
  pointer pcVar1;
  size_type sVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  
  sVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>,_KV::KeyValues::kvCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>_>_>
          ::count(&(this->keyvalues)._M_t,keyName);
  if (index < sVar2) {
    p_Var3 = (this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 == (_Rb_tree_node_base *)0x0) {
      p_Var3 = &(this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      for (p_Var4 = p_Var3->_M_left; p_Var4 != (_Base_ptr)0x0; p_Var4 = p_Var4->_M_left) {
        p_Var3 = p_Var4;
      }
    }
    if ((long)index < 1) {
      if (index != 0) {
        do {
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
          index = index + 1;
        } while (index != 0);
      }
    }
    else {
      do {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        index = index - 1;
      } while (index != 0);
    }
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
              (__return_storage_ptr__,(optional<std::__cxx11::string> *)(*(long *)(p_Var3 + 2) + 8),
               defaultVal);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (defaultVal->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + defaultVal->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KeyValues::getKeyValue( const std::string &keyName, size_t index, const std::string &defaultVal /*= ""*/ ) const
	{
		const size_t count = keyvalues.count( keyName );

		if ( index >= count )
			return defaultVal;

		auto range = keyvalues.equal_range( keyName );
		auto it = range.first;
		std::advance( it, index );

		return it->second->getValue( defaultVal );
	}